

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uprops.cpp
# Opt level: O0

int32_t u_getFC_NFKC_Closure_63(UChar32 c,UChar *dest,int32_t destCapacity,UErrorCode *pErrorCode)

{
  undefined8 this;
  UBool UVar1;
  uint16_t norm16;
  int32_t textLength;
  UNormalizationCheckResult UVar2;
  Normalizer2Impl *this_00;
  UnicodeString *src;
  Char16Ptr local_170;
  undefined1 local_168 [8];
  UnicodeString kc2;
  UnicodeString folded2String;
  UnicodeString kc1;
  Normalizer2Impl *nfkcImpl;
  char16_t *pcStack_78;
  int32_t folded1Length;
  UChar *folded1;
  UnicodeString folded1String;
  Normalizer2 *nfkc;
  UErrorCode *pErrorCode_local;
  int32_t destCapacity_local;
  UChar *dest_local;
  UChar32 c_local;
  
  if ((pErrorCode == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*pErrorCode), UVar1 != '\0')) {
    return 0;
  }
  if ((destCapacity < 0) || ((dest == (UChar *)0x0 && (0 < destCapacity)))) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return 0;
  }
  folded1String.fUnion._48_8_ = icu_63::Normalizer2::getNFKCInstance(pErrorCode);
  UVar1 = U_FAILURE(*pErrorCode);
  if (UVar1 != '\0') {
    return 0;
  }
  icu_63::UnicodeString::UnicodeString((UnicodeString *)&folded1);
  textLength = ucase_toFullFolding_63(c,&stack0xffffffffffffff88,0);
  if (textLength < 0) {
    this_00 = icu_63::Normalizer2Factory::getImpl((Normalizer2 *)folded1String.fUnion._48_8_);
    norm16 = icu_63::Normalizer2Impl::getNorm16(this_00,c);
    UVar2 = icu_63::Normalizer2Impl::getCompQuickCheck(this_00,norm16);
    if (UVar2 != UNORM_NO) {
      dest_local._4_4_ = u_terminateUChars_63(dest,destCapacity,0,pErrorCode);
      goto LAB_003cf20a;
    }
    icu_63::UnicodeString::setTo((UnicodeString *)&folded1,c);
  }
  else if (textLength < 0x20) {
    icu_63::ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)((long)&kc1.fUnion + 0x30),pcStack_78);
    icu_63::UnicodeString::setTo
              ((UnicodeString *)&folded1,'\0',(ConstChar16Ptr *)((long)&kc1.fUnion + 0x30),
               textLength);
    icu_63::ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)((long)&kc1.fUnion + 0x30));
  }
  else {
    icu_63::UnicodeString::setTo((UnicodeString *)&folded1,textLength);
  }
  icu_63::Normalizer2::normalize
            ((UnicodeString *)((long)&folded2String.fUnion + 0x30),
             (Normalizer2 *)folded1String.fUnion._48_8_,(UnicodeString *)&folded1,pErrorCode);
  icu_63::UnicodeString::UnicodeString
            ((UnicodeString *)((long)&kc2.fUnion + 0x30),
             (UnicodeString *)((long)&folded2String.fUnion + 0x30));
  this = folded1String.fUnion._48_8_;
  src = icu_63::UnicodeString::foldCase((UnicodeString *)((long)&kc2.fUnion + 0x30),0);
  icu_63::Normalizer2::normalize((UnicodeString *)local_168,(Normalizer2 *)this,src,pErrorCode);
  UVar1 = U_FAILURE(*pErrorCode);
  if ((UVar1 == '\0') &&
     (UVar1 = icu_63::UnicodeString::operator==
                        ((UnicodeString *)((long)&folded2String.fUnion + 0x30),
                         (UnicodeString *)local_168), UVar1 == '\0')) {
    icu_63::Char16Ptr::Char16Ptr(&local_170,dest);
    dest_local._4_4_ =
         icu_63::UnicodeString::extract
                   ((UnicodeString *)local_168,&local_170,destCapacity,pErrorCode);
    icu_63::Char16Ptr::~Char16Ptr(&local_170);
  }
  else {
    dest_local._4_4_ = u_terminateUChars_63(dest,destCapacity,0,pErrorCode);
  }
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_168);
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)((long)&kc2.fUnion + 0x30));
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)((long)&folded2String.fUnion + 0x30));
LAB_003cf20a:
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)&folded1);
  return dest_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_getFC_NFKC_Closure(UChar32 c, UChar *dest, int32_t destCapacity, UErrorCode *pErrorCode) {
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(destCapacity<0 || (dest==NULL && destCapacity>0)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    // Compute the FC_NFKC_Closure on the fly:
    // We have the API for complete coverage of Unicode properties, although
    // this value by itself is not useful via API.
    // (What could be useful is a custom normalization table that combines
    // case folding and NFKC.)
    // For the derivation, see Unicode's DerivedNormalizationProps.txt.
    const Normalizer2 *nfkc=Normalizer2::getNFKCInstance(*pErrorCode);
    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    // first: b = NFKC(Fold(a))
    UnicodeString folded1String;
    const UChar *folded1;
    int32_t folded1Length=ucase_toFullFolding(c, &folded1, U_FOLD_CASE_DEFAULT);
    if(folded1Length<0) {
        const Normalizer2Impl *nfkcImpl=Normalizer2Factory::getImpl(nfkc);
        if(nfkcImpl->getCompQuickCheck(nfkcImpl->getNorm16(c))!=UNORM_NO) {
            return u_terminateUChars(dest, destCapacity, 0, pErrorCode);  // c does not change at all under CaseFolding+NFKC
        }
        folded1String.setTo(c);
    } else {
        if(folded1Length>UCASE_MAX_STRING_LENGTH) {
            folded1String.setTo(folded1Length);
        } else {
            folded1String.setTo(FALSE, folded1, folded1Length);
        }
    }
    UnicodeString kc1=nfkc->normalize(folded1String, *pErrorCode);
    // second: c = NFKC(Fold(b))
    UnicodeString folded2String(kc1);
    UnicodeString kc2=nfkc->normalize(folded2String.foldCase(), *pErrorCode);
    // if (c != b) add the mapping from a to c
    if(U_FAILURE(*pErrorCode) || kc1==kc2) {
        return u_terminateUChars(dest, destCapacity, 0, pErrorCode);
    } else {
        return kc2.extract(dest, destCapacity, *pErrorCode);
    }
}